

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O2

void TestDoubleToShortest(void)

{
  bool bVar1;
  undefined1 in_CL;
  undefined1 uVar2;
  char *in_R8;
  char *in_R9;
  StringBuilder local_250;
  DoubleToStringConverter local_238;
  DoubleToStringConverter local_208;
  DoubleToStringConverter local_1d8;
  DoubleToStringConverter local_1a8;
  DoubleToStringConverter local_178;
  DoubleToStringConverter local_148;
  DoubleToStringConverter local_118;
  DoubleToStringConverter local_e8;
  DoubleToStringConverter local_b8;
  char buffer [128];
  char *pcVar3;
  
  local_250.buffer_.start_ = buffer;
  local_250.buffer_.length_ = 0x80;
  local_250.position_ = 0;
  local_238.flags_ = 9;
  local_238.infinity_symbol_ = (char *)0x0;
  local_238.nan_symbol_ = (char *)0x0;
  local_238.exponent_character_ = 'e';
  local_238.decimal_in_shortest_low_ = -6;
  local_238.decimal_in_shortest_high_ = 0x15;
  local_238.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_238.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_238.min_exponent_width_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_238,0.0,&local_250);
  CheckHelper((char *)0x30,0xc0dc21,(char *)(ulong)bVar1,(bool)in_CL);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x31,0xc08053,"0",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_238,12345.0,&local_250);
  CheckHelper((char *)0x34,0xc0dc51,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x35,0xc0dc72,"12345",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_238,1.2345e+27,&local_250);
  CheckHelper((char *)0x38,0xc0dc7a,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x39,0xc0dc9c,"1.2345e+27",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_238,1e+21,&local_250);
  CheckHelper((char *)0x3c,0xc0dcb4,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x3d,0xc0dcd2,"1e+21",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_238,1e-23,&local_250);
  CheckHelper((char *)0x40,0xc0dcda,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x41,0xc0dcf9,"1e-23",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_238,1e+20,&local_250);
  CheckHelper((char *)0x44,0xc0dd07,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x45,0xc0dd25,"100000000000000000000",local_250.buffer_.start_,in_R8,
                    in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest
                    (&local_238,1.1111111111111111e+20,&local_250);
  CheckHelper((char *)0x48,0xc0dd53,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x49,0xc0dd84,"111111111111111110000",local_250.buffer_.start_,in_R8,
                    in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest
                    (&local_238,1.1111111111111111e+21,&local_250);
  CheckHelper((char *)0x4c,0xc0dd9c,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x4d,0xc0ddce,"1.1111111111111111e+21",local_250.buffer_.start_,in_R8,
                    in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest
                    (&local_238,1.1111111111111111e+22,&local_250);
  CheckHelper((char *)0x50,0xc0dde7,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x51,0xc0de1a,"1.1111111111111111e+22",local_250.buffer_.start_,in_R8,
                    in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_238,-1e-05,&local_250);
  CheckHelper((char *)0x54,0xc0de33,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x55,0xc0de55,"-0.00001",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_238,-1e-06,&local_250);
  CheckHelper((char *)0x58,0xc0de69,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x59,0xc0de8c,"-0.000001",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_238,-1e-07,&local_250);
  CheckHelper((char *)0x5c,0xc0dea2,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x5d,0xc0dec6,"-1e-7",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_238,-0.0,&local_250);
  CheckHelper((char *)0x60,0xc0ded4,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x61,0xc08053,"0",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1a8.flags_ = 9;
  local_1a8.infinity_symbol_ = (char *)0x0;
  local_1a8.nan_symbol_ = (char *)0x0;
  local_1a8.exponent_character_ = 'e';
  local_1a8.decimal_in_shortest_low_ = -4;
  local_1a8.decimal_in_shortest_high_ = 6;
  local_1a8.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_1a8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_1a8.min_exponent_width_ = 2;
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest
                    (&local_1a8,11111111111.0,&local_250);
  CheckHelper((char *)0x69,0xc0def2,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x6a,0xc0df22,"1.1111111111e+10",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_1a8,1111111111.0,&local_250)
  ;
  CheckHelper((char *)0x6d,0xc0df46,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x6e,0xc0df75,"1.111111111e+09",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_1a8,1111111.0,&local_250);
  CheckHelper((char *)0x71,0xc0df97,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x72,0xc0dfc3,"1.111111e+06",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_1a8,111111.0,&local_250);
  CheckHelper((char *)0x75,0xc0dfdf,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x76,0xc0e00a,"111111",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest
                    (&local_1a8,10000000000.0,&local_250);
  CheckHelper((char *)0x79,0xc0e01a,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x7a,0xc0e04a,"1e+10",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_1a8,1000000000.0,&local_250)
  ;
  CheckHelper((char *)0x7d,0xc0e052,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x7e,0xc0e081,"1e+09",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_1d8.flags_ = 9;
  local_1d8.infinity_symbol_ = (char *)0x0;
  local_1d8.nan_symbol_ = (char *)0x0;
  local_1d8.exponent_character_ = 'e';
  local_1d8.decimal_in_shortest_low_ = -4;
  local_1d8.decimal_in_shortest_high_ = 6;
  local_1d8.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_1d8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_1d8.min_exponent_width_ = 0;
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest
                    (&local_1d8,11111111111.0,&local_250);
  CheckHelper((char *)0x83,0xc0e089,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x84,0xc0df22,"1.1111111111e+10",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_1d8,1111111111.0,&local_250)
  ;
  CheckHelper((char *)0x87,0xc0e0b9,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x88,0xc0e0e8,"1.111111111e+9",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_1d8,1111111.0,&local_250);
  CheckHelper((char *)0x8b,0xc0e108,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x8c,0xc0e134,"1.111111e+6",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_1d8,111111.0,&local_250);
  CheckHelper((char *)0x8f,0xc0e14e,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x90,0xc0e00a,"111111",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest
                    (&local_1d8,10000000000.0,&local_250);
  CheckHelper((char *)0x93,0xc0e179,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x94,0xc0e04a,"1e+10",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_1d8,1000000000.0,&local_250)
  ;
  CheckHelper((char *)0x97,0xc0e1a9,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x98,0xc0e1d8,"1e+9",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_208.flags_ = 9;
  local_208.infinity_symbol_ = (char *)0x0;
  local_208.nan_symbol_ = (char *)0x0;
  local_208.exponent_character_ = 'e';
  local_208.decimal_in_shortest_low_ = -4;
  local_208.decimal_in_shortest_high_ = 6;
  local_208.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_208.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_208.min_exponent_width_ = 100;
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest
                    (&local_208,11111111111.0,&local_250);
  CheckHelper((char *)0x9f,0xc0e1df,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xa0,0xc0e211,"1.1111111111e+00010",local_250.buffer_.start_,in_R8,in_R9
                   );
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_208,1111111111.0,&local_250)
  ;
  CheckHelper((char *)0xa3,0xc0e23b,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xa4,0xc0e26c,"1.111111111e+00009",local_250.buffer_.start_,in_R8,in_R9)
  ;
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_208,1111111.0,&local_250);
  CheckHelper((char *)0xa7,0xc0e294,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xa8,0xc0e2c2,"1.111111e+00006",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_208,111111.0,&local_250);
  CheckHelper((char *)0xab,0xc0e2e4,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xac,0xc0e00a,"111111",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest
                    (&local_208,10000000000.0,&local_250);
  CheckHelper((char *)0xaf,0xc0e311,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xb0,0xc0e343,"1e+00010",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_208,1000000000.0,&local_250)
  ;
  CheckHelper((char *)0xb3,0xc0e34e,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xb4,0xc0e37f,"1e+00009",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_148.flags_ = 0;
  local_148.infinity_symbol_ = (char *)0x0;
  local_148.nan_symbol_ = (char *)0x0;
  local_148.exponent_character_ = 'e';
  local_148.decimal_in_shortest_low_ = -1;
  local_148.decimal_in_shortest_high_ = 1;
  local_148.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_148.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_148.min_exponent_width_ = 0;
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_148,0.1,&local_250);
  CheckHelper((char *)0xba,0xc0e38a,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xbb,0xc0e3a8,"0.1",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_148,0.01,&local_250);
  CheckHelper((char *)0xbe,0xc0e3ae,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xbf,0xc0e3cd,"1e-2",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_148,1.0,&local_250);
  CheckHelper((char *)0xc2,0xc0e3d9,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xc3,0xc080e3,"1",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_148,10.0,&local_250);
  CheckHelper((char *)0xc6,0xc0e3f7,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xc7,0xc0e416,"1e1",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_148,-0.0,&local_250);
  CheckHelper((char *)0xca,0xc0e420,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xcb,0xc0e43f,"-0",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_b8.flags_ = 6;
  local_b8.infinity_symbol_ = (char *)0x0;
  local_b8.nan_symbol_ = (char *)0x0;
  local_b8.exponent_character_ = 'E';
  local_b8.decimal_in_shortest_low_ = -5;
  local_b8.decimal_in_shortest_high_ = 5;
  local_b8.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_b8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_b8.min_exponent_width_ = 0;
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_b8,0.1,&local_250);
  CheckHelper((char *)0xd2,0xc0e444,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xd3,0xc0e3a8,"0.1",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_b8,1.0,&local_250);
  CheckHelper((char *)0xd6,0xc0e462,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xd7,0xc0e480,"1.0",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_b8,10000.0,&local_250);
  CheckHelper((char *)0xda,0xc0e486,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xdb,0xc0e4a8,"10000.0",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_b8,100000.0,&local_250);
  CheckHelper((char *)0xde,0xc0e4ba,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xdf,0xc0e4dd,"1E5",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_178.flags_ = 1;
  local_178.infinity_symbol_ = (char *)0x0;
  local_178.nan_symbol_ = (char *)0x0;
  local_178.exponent_character_ = 'e';
  local_178.decimal_in_shortest_low_ = -6;
  local_178.decimal_in_shortest_high_ = 0x15;
  local_178.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_178.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_178.min_exponent_width_ = 0;
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_178,1e-06,&local_250);
  CheckHelper((char *)0xe6,0xc0e4e7,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xe7,0xc0e50a,"0.000001",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_178,1e-07,&local_250);
  CheckHelper((char *)0xea,0xc0e515,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xeb,0xc0e539,"1e-7",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest
                    (&local_178,1.1111111111111111e+20,&local_250);
  CheckHelper((char *)0xee,0xc0e540,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xef,0xc0dd84,"111111111111111110000",local_250.buffer_.start_,in_R8,
                    in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_178,1e+20,&local_250);
  CheckHelper((char *)0xf2,0xc0e572,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xf3,0xc0dd25,"100000000000000000000",local_250.buffer_.start_,in_R8,
                    in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest
                    (&local_178,1.1111111111111111e+21,&local_250);
  CheckHelper((char *)0xf6,0xc0e5a4,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0xf7,0xc0ddce,"1.1111111111111111e+21",local_250.buffer_.start_,in_R8,
                    in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_e8.flags_ = 1;
  local_e8.infinity_symbol_ = (char *)0x0;
  local_e8.nan_symbol_ = (char *)0x0;
  local_e8.exponent_character_ = 'e';
  local_e8.min_exponent_width_ = 0;
  local_e8.decimal_in_shortest_low_ = 0;
  local_e8.decimal_in_shortest_high_ = 0;
  local_e8.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_e8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_e8,INFINITY,&local_250);
  CheckHelper((char *)0xfd,0xc0e5d7,(char *)(ulong)!bVar1,(bool)uVar2);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_e8,-INFINITY,&local_250);
  CheckHelper((char *)0x100,0xc0e605,(char *)(ulong)!bVar1,(bool)uVar2);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_e8,NAN,&local_250);
  CheckHelper((char *)0x103,0xc0e634,(char *)(ulong)!bVar1,(bool)uVar2);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_e8,-NAN,&local_250);
  CheckHelper((char *)0x106,0xc0e65d,(char *)(ulong)!bVar1,(bool)uVar2);
  local_118.flags_ = 1;
  local_118.infinity_symbol_ = "Infinity";
  local_118.nan_symbol_ = "NaN";
  local_118.exponent_character_ = 'e';
  local_118.decimal_in_shortest_low_ = 0;
  local_118.decimal_in_shortest_high_ = 0;
  local_118.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_118.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_118.min_exponent_width_ = 0;
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_118,INFINITY,&local_250);
  CheckHelper((char *)0x10b,0xc0e687,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x10c,0xc0e6b4,"Infinity",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_118,-INFINITY,&local_250);
  CheckHelper((char *)0x10f,0xc0e6bf,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x110,0xc0e6ed,"-Infinity",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_118,NAN,&local_250);
  CheckHelper((char *)0x113,0xc0e703,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  pcVar3 = local_250.buffer_.start_;
  CheckEqualsHelper((char *)0x114,0xc0e72b,"NaN",local_250.buffer_.start_,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  local_250.position_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortest(&local_118,-NAN,&local_250);
  CheckHelper((char *)0x117,0xc0e731,(char *)(ulong)bVar1,(bool)uVar2);
  local_250.buffer_.start_[local_250.position_] = '\0';
  local_250.position_ = -1;
  CheckEqualsHelper((char *)0x118,0xc0e72b,"NaN",local_250.buffer_.start_,in_R8,in_R9);
  if (-1 < (long)local_250.position_) {
    local_250.buffer_.start_[local_250.position_] = '\0';
  }
  return;
}

Assistant:

TEST(DoubleToShortest) {
  const int kBufferSize = 128;
  char buffer[kBufferSize];
  StringBuilder builder(buffer, kBufferSize);
  int flags = DoubleToStringConverter::UNIQUE_ZERO |
      DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN;
  DoubleToStringConverter dc(flags, NULL, NULL, 'e', -6, 21, 0, 0);

  CHECK(dc.ToShortest(0.0, &builder));
  CHECK_EQ("0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(12345.0, &builder));
  CHECK_EQ("12345", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(12345e23, &builder));
  CHECK_EQ("1.2345e+27", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(1e21, &builder));
  CHECK_EQ("1e+21", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(1e-23, &builder));
  CHECK_EQ("1e-23", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(1e20, &builder));
  CHECK_EQ("100000000000000000000", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(111111111111111111111.0, &builder));
  CHECK_EQ("111111111111111110000", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(1111111111111111111111.0, &builder));
  CHECK_EQ("1.1111111111111111e+21", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(11111111111111111111111.0, &builder));
  CHECK_EQ("1.1111111111111111e+22", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(-0.00001, &builder));
  CHECK_EQ("-0.00001", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(-0.000001, &builder));
  CHECK_EQ("-0.000001", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(-0.0000001, &builder));
  CHECK_EQ("-1e-7", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(-0.0, &builder));
  CHECK_EQ("0", builder.Finalize());

  // Test min_exponent_width
  flags = DoubleToStringConverter::UNIQUE_ZERO |
      DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN;
  DoubleToStringConverter dcExpWidth2(flags, NULL, NULL, 'e', -4, 6, 0, 0, 2);

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(11111111111.0, &builder));
  CHECK_EQ("1.1111111111e+10", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(1111111111.0, &builder));
  CHECK_EQ("1.111111111e+09", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(1111111.0, &builder));
  CHECK_EQ("1.111111e+06", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(111111.0, &builder));
  CHECK_EQ("111111", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(10000000000.0, &builder));
  CHECK_EQ("1e+10", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(1000000000.0, &builder));
  CHECK_EQ("1e+09", builder.Finalize());

  DoubleToStringConverter dcExpWidth0(flags, NULL, NULL, 'e', -4, 6, 0, 0, 0);

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(11111111111.0, &builder));
  CHECK_EQ("1.1111111111e+10", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(1111111111.0, &builder));
  CHECK_EQ("1.111111111e+9", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(1111111.0, &builder));
  CHECK_EQ("1.111111e+6", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(111111.0, &builder));
  CHECK_EQ("111111", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(10000000000.0, &builder));
  CHECK_EQ("1e+10", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(1000000000.0, &builder));
  CHECK_EQ("1e+9", builder.Finalize());

  // Set min_exponent_width to 100 is equal to 5,
  // as kMaxExponentLength is defined to 5 in double-to-string.cc
  DoubleToStringConverter dcExpWidth100(flags, NULL, NULL, 'e', -4, 6, 0, 0, 100);

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(11111111111.0, &builder));
  CHECK_EQ("1.1111111111e+00010", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(1111111111.0, &builder));
  CHECK_EQ("1.111111111e+00009", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(1111111.0, &builder));
  CHECK_EQ("1.111111e+00006", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(111111.0, &builder));
  CHECK_EQ("111111", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(10000000000.0, &builder));
  CHECK_EQ("1e+00010", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(1000000000.0, &builder));
  CHECK_EQ("1e+00009", builder.Finalize());
  // End of min_exponent_width testing

  flags = DoubleToStringConverter::NO_FLAGS;
  DoubleToStringConverter dc2(flags, NULL, NULL, 'e', -1, 1, 0, 0);
  builder.Reset();
  CHECK(dc2.ToShortest(0.1, &builder));
  CHECK_EQ("0.1", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortest(0.01, &builder));
  CHECK_EQ("1e-2", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortest(1.0, &builder));
  CHECK_EQ("1", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortest(10.0, &builder));
  CHECK_EQ("1e1", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortest(-0.0, &builder));
  CHECK_EQ("-0", builder.Finalize());

  flags = DoubleToStringConverter::EMIT_TRAILING_DECIMAL_POINT |
      DoubleToStringConverter::EMIT_TRAILING_ZERO_AFTER_POINT;
  DoubleToStringConverter dc3(flags, NULL, NULL, 'E', -5, 5, 0, 0);

  builder.Reset();
  CHECK(dc3.ToShortest(0.1, &builder));
  CHECK_EQ("0.1", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToShortest(1.0, &builder));
  CHECK_EQ("1.0", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToShortest(10000.0, &builder));
  CHECK_EQ("10000.0", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToShortest(100000.0, &builder));
  CHECK_EQ("1E5", builder.Finalize());

  // Test the examples in the comments of ToShortest.
  flags = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN;
  DoubleToStringConverter dc4(flags, NULL, NULL, 'e', -6, 21, 0, 0);

  builder.Reset();
  CHECK(dc4.ToShortest(0.000001, &builder));
  CHECK_EQ("0.000001", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortest(0.0000001, &builder));
  CHECK_EQ("1e-7", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortest(111111111111111111111.0, &builder));
  CHECK_EQ("111111111111111110000", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortest(100000000000000000000.0, &builder));
  CHECK_EQ("100000000000000000000", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortest(1111111111111111111111.0, &builder));
  CHECK_EQ("1.1111111111111111e+21", builder.Finalize());

  // Test special value handling.
  DoubleToStringConverter dc5(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(!dc5.ToShortest(Double::Infinity(), &builder));

  builder.Reset();
  CHECK(!dc5.ToShortest(-Double::Infinity(), &builder));

  builder.Reset();
  CHECK(!dc5.ToShortest(Double::NaN(), &builder));

  builder.Reset();
  CHECK(!dc5.ToShortest(-Double::NaN(), &builder));

  DoubleToStringConverter dc6(flags, "Infinity", "NaN", 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc6.ToShortest(Double::Infinity(), &builder));
  CHECK_EQ("Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToShortest(-Double::Infinity(), &builder));
  CHECK_EQ("-Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToShortest(Double::NaN(), &builder));
  CHECK_EQ("NaN", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToShortest(-Double::NaN(), &builder));
  CHECK_EQ("NaN", builder.Finalize());
}